

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::Builder(Builder *this,Buffer<unsigned_char> *buffer)

{
  uchar *puVar1;
  ValueLength VVar2;
  Buffer<unsigned_char> *in_RSI;
  pointer in_RDI;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *unaff_retaddr;
  arena_type *this_00;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *this_01;
  Buffer<unsigned_char> *local_10;
  pointer __n;
  
  local_10 = in_RSI;
  __n = in_RDI;
  std::shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_>::shared_ptr
            ((shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *)0x10738d);
  in_RDI[1].startPos = (ValueLength)local_10;
  puVar1 = Buffer<unsigned_char>::data((Buffer<unsigned_char> *)in_RDI[1].startPos);
  in_RDI[1].indexStartPos = (ValueLength)puVar1;
  VVar2 = Buffer<unsigned_char>::size(local_10);
  in_RDI[2].startPos = VVar2;
  this_00 = (arena_type *)&in_RDI[2].indexStartPos;
  arena<64UL,_8UL>::arena(this_00);
  this_01 = (vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
             *)&stack0xffffffffffffffe8;
  short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>::short_alloc
            ((short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL> *)this_01,this_00)
  ;
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::vector(this_01,(allocator_type *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x107411);
  *(undefined1 *)&in_RDI[10].indexStartPos = 0;
  in_RDI[0xb].startPos = (ValueLength)&Options::Defaults;
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::reserve(unaff_retaddr,(size_type)__n);
  return;
}

Assistant:

Builder::Builder(Buffer<uint8_t>& buffer) noexcept
    : _bufferPtr(&buffer),
      _start(_bufferPtr->data()),
      _pos(buffer.size()),
      _arena(),
      _stack(_arena),
      _keyWritten(false),
      options(&Options::Defaults) {
  // do a full initial allocation in the arena, so we can maximize its usage
  _stack.reserve(arenaSize / sizeof(decltype(_stack)::value_type));
}